

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t helper_float_trunc_2008_w_s_mips64(CPUMIPSState_conflict5 *env,uint32_t fst0)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  
  uVar1 = float32_to_int32_round_to_zero_mips64(fst0,&(env->active_fpu).fp_status);
  uVar2 = 0;
  if ((fst0 & 0x7fffffff) < 0x7f800001) {
    uVar2 = uVar1;
  }
  if (((env->active_fpu).fp_status.float_exception_flags & 1) != 0) {
    uVar1 = uVar2;
  }
  update_fcr31(env,unaff_retaddr);
  return uVar1;
}

Assistant:

uint32_t helper_float_trunc_2008_w_s(CPUMIPSState *env, uint32_t fst0)
{
    uint32_t wt2;

    wt2 = float32_to_int32_round_to_zero(fst0, &env->active_fpu.fp_status);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float32_is_any_nan(fst0)) {
            wt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return wt2;
}